

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

mecab_learner_node_t * __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::getBOSNode
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,
          Allocator<mecab_learner_node_t,_mecab_learner_path_t> *allocator)

{
  long lVar1;
  mecab_learner_node_t *__s;
  
  __s = FreeList<mecab_learner_node_t>::alloc
                  (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
  memset(__s,0,0x98);
  lVar1 = *(long *)(allocator + 8);
  *(long *)(allocator + 8) = lVar1 + 1;
  __s->id = (uint)lVar1;
  __s->surface = "BOS/EOS";
  __s->feature = (this->bos_feature_).super_scoped_array<char>.ptr_;
  __s->stat = '\x02';
  __s->isbest = '\x01';
  return __s;
}

Assistant:

N *Tokenizer<N, P>::getBOSNode(Allocator<N, P> *allocator) const {
  N *bos_node = allocator->newNode();
  bos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  bos_node->feature = bos_feature_.get();
  bos_node->isbest = 1;
  bos_node->stat = MECAB_BOS_NODE;
  return bos_node;
}